

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSLUtils.hpp
# Opt level: O3

void Diligent::HandleHLSLCompilerResult<IDxcBlob>
               (bool CompilationSucceeded,IDxcBlob *pCompilerMsgBlob,string *ShaderSource,
               char *ShaderName,IDataBlob **ppOutputLog)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t __n;
  void *__dest;
  size_t sVar4;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args;
  char *pcVar6;
  string _msg;
  RefCntAutoPtr<Diligent::DataBlobImpl> pOutputLogBlob;
  void *local_218;
  string local_208;
  char *local_1e8;
  string *local_1e0;
  long *local_1d8 [2];
  long local_1c8 [2];
  undefined1 local_1b8 [16];
  IMemoryAllocator *local_1a8;
  ios_base local_138 [264];
  undefined4 extraout_var_00;
  
  if (pCompilerMsgBlob == (IDxcBlob *)0x0) {
LAB_002a3d01:
    bVar2 = false;
    local_218 = (void *)0x0;
    __n = 0;
  }
  else {
    iVar3 = (*(pCompilerMsgBlob->super_IUnknown)._vptr_IUnknown[3])(pCompilerMsgBlob);
    local_218 = (void *)CONCAT44(extraout_var,iVar3);
    if (local_218 == (void *)0x0) goto LAB_002a3d01;
    iVar3 = (*(pCompilerMsgBlob->super_IUnknown)._vptr_IUnknown[4])(pCompilerMsgBlob);
    __n = CONCAT44(extraout_var_00,iVar3);
    bVar2 = true;
  }
  if (ppOutputLog != (IDataBlob **)0x0) {
    sVar4 = ShaderSource->_M_string_length;
    local_1e8 = ShaderName;
    local_1e0 = ShaderSource;
    DataBlobImpl::Create((DataBlobImpl *)local_1b8,__n + sVar4 + 2,(void *)0x0);
    __dest = DataBlobImpl::GetDataPtr((DataBlobImpl *)local_1b8._0_8_,0);
    if (bVar2) {
      memcpy(__dest,local_218,__n);
    }
    *(undefined1 *)((long)__dest + __n) = 0;
    memcpy((void *)((long)__dest + __n + 1),(local_1e0->_M_dataplus)._M_p,sVar4);
    *(undefined1 *)((long)__dest + sVar4 + 1 + __n) = 0;
    DataBlobImpl::QueryInterface
              ((DataBlobImpl *)local_1b8._0_8_,(INTERFACE_ID *)IID_DataBlob,(IObject **)ppOutputLog)
    ;
    RefCntAutoPtr<Diligent::DataBlobImpl>::Release
              ((RefCntAutoPtr<Diligent::DataBlobImpl> *)local_1b8);
    ShaderName = local_1e8;
  }
  if (__n == 0 && CompilationSucceeded) {
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  pcVar6 = "Failed to compile shader \'";
  if (CompilationSucceeded) {
    pcVar6 = "Compiler output for shader \'";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,pcVar6,(ulong)CompilationSucceeded * 2 + 0x1a);
  pcVar6 = "<unknown>";
  if (ShaderName != (char *)0x0) {
    pcVar6 = ShaderName;
  }
  sVar4 = strlen(pcVar6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar6,sVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\'",1);
  if (bVar2 && __n != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    cVar1 = (char)(ostream *)&local_1a8;
    std::ios::widen((char)local_1a8[-3]._vptr_IMemoryAllocator + cVar1);
    std::ostream::put(cVar1);
    poVar5 = (ostream *)std::ostream::flush();
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_208,local_218,__n + (long)local_218);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,local_208._M_dataplus._M_p,local_208._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if (CompilationSucceeded) {
LAB_002a3edc:
      std::__cxx11::stringbuf::str();
      FormatString<std::__cxx11::string>(&local_208,(Diligent *)local_1d8,Args);
      if (local_1d8[0] != local_1c8) {
        operator_delete(local_1d8[0],local_1c8[0] + 1);
      }
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(0,local_208._M_dataplus._M_p,0,0,0);
      }
      goto LAB_002a3f78;
    }
  }
  else {
    if (CompilationSucceeded) goto LAB_002a3edc;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8," (no shader log available).",0x1b);
  }
  std::__cxx11::stringbuf::str();
  LogError<true,std::__cxx11::string>
            (false,"HandleHLSLCompilerResult",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/include/HLSLUtils.hpp"
             ,0x60,&local_208);
LAB_002a3f78:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void HandleHLSLCompilerResult(bool               CompilationSucceeded,
                              BlobType*          pCompilerMsgBlob,
                              const std::string& ShaderSource,
                              const char*        ShaderName,
                              IDataBlob**        ppOutputLog) noexcept(false)
{
    const char*  CompilerMsg    = pCompilerMsgBlob ? static_cast<const char*>(pCompilerMsgBlob->GetBufferPointer()) : nullptr;
    const size_t CompilerMsgLen = CompilerMsg ? pCompilerMsgBlob->GetBufferSize() : 0;

    if (ppOutputLog != nullptr)
    {
        const size_t                ShaderSourceLen = ShaderSource.length();
        RefCntAutoPtr<DataBlobImpl> pOutputLogBlob  = DataBlobImpl::Create(ShaderSourceLen + 1 + CompilerMsgLen + 1);

        char* log = pOutputLogBlob->GetDataPtr<char>();

        if (CompilerMsg != nullptr)
            memcpy(log, CompilerMsg, CompilerMsgLen);
        log[CompilerMsgLen] = 0; // Explicitly set null terminator
        log += CompilerMsgLen + 1;

        memcpy(log, ShaderSource.data(), ShaderSourceLen);
        log[ShaderSourceLen] = 0;

        pOutputLogBlob->QueryInterface(IID_DataBlob, reinterpret_cast<IObject**>(ppOutputLog));
    }

    if (!CompilationSucceeded || CompilerMsgLen != 0)
    {
        std::stringstream ss;
        ss << (CompilationSucceeded ? "Compiler output for shader '" : "Failed to compile shader '")
           << (ShaderName != nullptr ? ShaderName : "<unknown>")
           << "'";
        if (CompilerMsg != nullptr && CompilerMsgLen != 0)
        {
            ss << ":" << std::endl
               << std::string{CompilerMsg, CompilerMsgLen};
        }
        else if (!CompilationSucceeded)
        {
            ss << " (no shader log available).";
        }

        if (CompilationSucceeded)
        {
            LOG_INFO_MESSAGE(ss.str());
        }
        else
        {
            LOG_ERROR_AND_THROW(ss.str());
        }
    }
}